

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_write_u32(mpack_writer_t *writer,uint32_t value)

{
  _Bool _Var1;
  size_t sVar2;
  uint32_t value_local;
  mpack_writer_t *writer_local;
  
  mpack_writer_track_element(writer);
  if (value < 0x80) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((sVar2 != 0) || (_Var1 = mpack_writer_ensure(writer,1), _Var1)) {
      mpack_encode_fixuint(writer->current,(uint8_t)value);
      writer->current = writer->current + 1;
    }
  }
  else if (value < 0x100) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
      mpack_encode_u8(writer->current,(uint8_t)value);
      writer->current = writer->current + 2;
    }
  }
  else if (value < 0x10000) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((2 < sVar2) || (_Var1 = mpack_writer_ensure(writer,3), _Var1)) {
      mpack_encode_u16(writer->current,(uint16_t)value);
      writer->current = writer->current + 3;
    }
  }
  else {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((4 < sVar2) || (_Var1 = mpack_writer_ensure(writer,5), _Var1)) {
      mpack_encode_u32(writer->current,value);
      writer->current = writer->current + 5;
    }
  }
  return;
}

Assistant:

void mpack_write_u32(mpack_writer_t* writer, uint32_t value) {
    #if MPACK_OPTIMIZE_FOR_SIZE
    mpack_write_u64(writer, value);
    #else
    mpack_writer_track_element(writer);
    if (value <= 127) {
        MPACK_WRITE_ENCODED(mpack_encode_fixuint, MPACK_TAG_SIZE_FIXUINT, (uint8_t)value);
    } else if (value <= UINT8_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u8, MPACK_TAG_SIZE_U8, (uint8_t)value);
    } else if (value <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u16, MPACK_TAG_SIZE_U16, (uint16_t)value);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_u32, MPACK_TAG_SIZE_U32, value);
    }
    #endif
}